

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivVerify.cpp
# Opt level: O0

void DivVerifyInt64Uint32(void)

{
  bool bVar1;
  TestCase<long,_unsigned_int,_1> TVar2;
  int64_t x;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  int64_t ret;
  TestCase<long,_unsigned_int,_1> test;
  TestVector<long,_unsigned_int,_1> tests;
  allocator *in_stack_fffffffffffffed8;
  allocator *in_stack_fffffffffffffee0;
  TestVector<long,_unsigned_int,_1> *in_stack_fffffffffffffee8;
  TestVector<long,_unsigned_int,_1> *this;
  allocator *in_stack_fffffffffffffef0;
  long local_100;
  uint local_f8;
  bool bStack_f4;
  allocator local_d9;
  string local_d8 [36];
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_b4;
  long local_b0;
  allocator local_a1;
  string local_a0 [3];
  undefined1 in_stack_ffffffffffffff63;
  uint in_stack_ffffffffffffff64;
  long in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  TestVector<long,_unsigned_int,_1> local_80;
  allocator local_61;
  string local_60 [40];
  TestCase<long,_unsigned_int,_1> local_38;
  long local_28;
  uint local_20;
  byte local_1c;
  TestVector<long,_unsigned_int,_1> local_18;
  
  TestVector<long,_unsigned_int,_1>::TestVector(&local_18);
  local_38 = TestVector<long,_unsigned_int,_1>::GetNext(in_stack_fffffffffffffee8);
  local_28 = local_38.x;
  local_20 = local_38.y;
  local_1c = local_38.fExpected;
  while( true ) {
    bVar1 = TestVector<long,_unsigned_int,_1>::Done(&local_18);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bVar1 = SafeDivide<long,unsigned_int>
                      ((long)in_stack_fffffffffffffee0,
                       (uint)((ulong)in_stack_fffffffffffffed8 >> 0x20),(long *)0x19d033);
    if (bVar1 != (bool)(local_1c & 1)) {
      in_stack_fffffffffffffef0 = &local_61;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_60,"Error in case int64_uint32: ",in_stack_fffffffffffffef0);
      err_msg<long,unsigned_int>
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                 (bool)in_stack_ffffffffffffff63);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
    }
    local_80.count._3_1_ = 1;
    this = &local_80;
    SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)this,&local_28);
    SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/=
              ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)in_stack_fffffffffffffee0,(uint)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    if ((local_80.count._3_1_ & 1) != (local_1c & 1)) {
      in_stack_fffffffffffffee0 = &local_a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_a0,"Error in case int64_uint32 throw: ",in_stack_fffffffffffffee0);
      err_msg<long,unsigned_int>
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                 (bool)in_stack_ffffffffffffff63);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    }
    local_80.count._3_1_ = 1;
    local_b0 = local_28;
    SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(&local_b4,&local_20);
    operator/=((long *)this,
               (SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                )(uint)((ulong)in_stack_fffffffffffffef0 >> 0x20));
    if ((local_80.count._3_1_ & 1) != (local_1c & 1)) {
      in_stack_fffffffffffffed8 = &local_d9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_d8,"Error in case int64_uint32 throw: ",in_stack_fffffffffffffed8);
      err_msg<long,unsigned_int>
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                 (bool)in_stack_ffffffffffffff63);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    }
    TVar2 = TestVector<long,_unsigned_int,_1>::GetNext(this);
    local_100 = TVar2.x;
    local_f8 = TVar2.y;
    bStack_f4 = TVar2.fExpected;
    local_28 = local_100;
    local_20 = local_f8;
    local_1c = bStack_f4;
  }
  return;
}

Assistant:

void DivVerifyInt64Uint32()
{
    TestVector< std::int64_t, std::uint32_t, OpType::Div > tests;
    TestCase< std::int64_t, std::uint32_t, OpType::Div > test = tests.GetNext();

    while (!tests.Done())
    {
      std::int64_t ret;
      if( SafeDivide(test.x, test.y, ret) != test.fExpected )
      {
         //assert(false);
         err_msg( "Error in case int64_uint32: ", test.x, test.y, test.fExpected );
      }

      // Now test throwing version
      bool fSuccess = true;
      try
      {
         SafeInt<std::int64_t> si(test.x);
         si /= test.y;
      }
      catch(...)
      {
         fSuccess = false;
      }

      if( fSuccess != test.fExpected )
      {
         err_msg( "Error in case int64_uint32 throw: ", test.x, test.y, test.fExpected );
      }

      // Also need to test the version that assigns back out
      // to a plain int, as it has different logic
      fSuccess = true;
      try
      {
         std::int64_t x(test.x);
         x /= SafeInt<std::uint32_t>(test.y);
      }
      catch(...)
      {
         fSuccess = false;
      }

      if( fSuccess != test.fExpected )
      {
         err_msg( "Error in case int64_uint32 throw: ", test.x, test.y, test.fExpected );
      }

      test = tests.GetNext();
   }
}